

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O3

void __thiscall
MockFailureReporterForInCOnlyCode::failTest
          (MockFailureReporterForInCOnlyCode *this,MockFailure *failure)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CrashingTestTerminatorWithoutExceptions local_20;
  undefined1 local_18;
  
  iVar2 = (*(this->super_MockFailureReporter)._vptr_MockFailureReporter[3])();
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if (cVar1 == '\0') {
    iVar2 = (*(this->super_MockFailureReporter)._vptr_MockFailureReporter[3])(this);
    local_18 = (this->super_MockFailureReporter).crashOnFailure_;
    local_20.super_TestTerminatorWithoutExceptions.super_TestTerminator._vptr_TestTerminator =
         (TestTerminatorWithoutExceptions)&PTR_exitCurrentTest_001656c8;
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x138))
              ((long *)CONCAT44(extraout_var_00,iVar2),failure);
    CrashingTestTerminatorWithoutExceptions::~CrashingTestTerminatorWithoutExceptions(&local_20);
  }
  return;
}

Assistant:

void failTest(const MockFailure& failure) _override
    {
        if (!getTestToFail()->hasFailed())
            getTestToFail()->failWith(failure, MockFailureReporterTestTerminatorForInCOnlyCode(crashOnFailure_));
    }